

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator>::Lookup
          (PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator> *this,long *value)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  uint64_t offset;
  undefined8 local_18;
  
  local_18 = duckdb::Hash<long>(*in_RSI);
  local_18 = local_18 & *(ulong *)(in_RDI + 0x20);
  while( true ) {
    bVar1 = primitive_dictionary_entry_t::IsEmpty
                      ((primitive_dictionary_entry_t *)(*(long *)(in_RDI + 0x90) + local_18 * 0x10))
    ;
    bVar2 = false;
    if (!bVar1) {
      bVar2 = *(long *)(*(long *)(in_RDI + 0x90) + local_18 * 0x10) != *in_RSI;
    }
    if (!bVar2) break;
    local_18 = *(ulong *)(in_RDI + 0x20) & local_18 + 1;
  }
  return (primitive_dictionary_entry_t *)(*(long *)(in_RDI + 0x90) + local_18 * 0x10);
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}